

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

shared_ptr<QPDFObjectHandle::StreamDataProvider> __thiscall
qpdf::Stream::getStreamDataProvider(Stream *this)

{
  Members *pMVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Stream *in_RSI;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> sVar2;
  Stream *this_local;
  
  pMVar1 = stream(in_RSI);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)this,&pMVar1->stream_provider);
  sVar2.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (shared_ptr<QPDFObjectHandle::StreamDataProvider>)
         sVar2.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFObjectHandle::StreamDataProvider>
        getStreamDataProvider() const
        {
            return stream()->stream_provider;
        }